

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCase::initPrograms
          (LinearDerivateCase *this,SourceCollections *programCollection)

{
  DerivateCaseValues *b;
  Vec4 *a;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  SurfaceType SVar8;
  DerivateFunc DVar9;
  DataType dataType;
  mapped_type *pmVar10;
  ProgramSources *pPVar11;
  ulong uVar12;
  Precision in_ECX;
  Precision precision;
  Vec4 dx;
  string local_e8;
  Vec4 dy;
  string fragmentSrc;
  Vector<float,_4> local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  Vector<float,_4> local_40;
  Vector<float,_4> local_30;
  
  SVar8 = (this->super_TriangleDerivateCase).m_definitions.surfaceType;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dataType = TYPE_FLOAT_VEC4;
  if (SVar8 == SURFACETYPE_FLOAT_FBO) {
    dataType = TYPE_UINT_VEC4;
  }
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getDataTypeName(dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dx,"OUTPUT_TYPE",(allocator<char> *)&fragmentSrc);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dx);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dx);
  if (SVar8 == SURFACETYPE_FLOAT_FBO) {
    precision = PRECISION_HIGHP;
  }
  else {
    precision = (this->super_TriangleDerivateCase).m_definitions.precision;
  }
  glu::getPrecisionName(precision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dx,"OUTPUT_PREC",(allocator<char> *)&fragmentSrc);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dx);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dx);
  glu::getPrecisionName((this->super_TriangleDerivateCase).m_definitions.precision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dx,"PRECISION",(allocator<char> *)&fragmentSrc);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dx);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dx);
  glu::getDataTypeName((this->super_TriangleDerivateCase).m_definitions.dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dx,"DATATYPE",(allocator<char> *)&fragmentSrc);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dx);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dx);
  getDerivateFuncName((this->super_TriangleDerivateCase).m_definitions.func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dx,"FUNC",(allocator<char> *)&fragmentSrc);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dx);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dx);
  if (SVar8 == SURFACETYPE_FLOAT_FBO) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dx,"CAST_TO_OUTPUT",(allocator<char> *)&fragmentSrc);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&fragmentParams,(key_type *)&dx);
    std::__cxx11::string::assign((char *)pmVar10);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dx,"CAST_TO_OUTPUT",(allocator<char> *)&fragmentSrc);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&fragmentParams,(key_type *)&dx);
    std::__cxx11::string::assign((char *)pmVar10);
  }
  std::__cxx11::string::~string((string *)&dx);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&dx,&this->m_fragmentTmpl);
  tcu::StringTemplate::specialize(&fragmentSrc,(StringTemplate *)&dx,&fragmentParams);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&dx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"vert",(allocator<char> *)&local_88);
  pPVar11 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&programCollection->glslSources,(string *)&dy);
  sr::(anonymous_namespace)::genVertexSource_abi_cxx11_
            (&local_e8,
             (_anonymous_namespace_ *)
             (ulong)(this->super_TriangleDerivateCase).m_definitions.coordDataType,
             (this->super_TriangleDerivateCase).m_definitions.coordPrecision,in_ECX);
  glu::VertexSource::VertexSource((VertexSource *)&dx,&local_e8);
  glu::ProgramSources::operator<<(pPVar11,(ShaderSource *)&dx);
  std::__cxx11::string::~string((string *)(dx.m_data + 2));
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&dy);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"frag",(allocator<char> *)&local_e8);
  pPVar11 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&programCollection->glslSources,(string *)&dy);
  glu::FragmentSource::FragmentSource((FragmentSource *)&dx,&fragmentSrc);
  glu::ProgramSources::operator<<(pPVar11,(ShaderSource *)&dx);
  std::__cxx11::string::~string((string *)(dx.m_data + 2));
  std::__cxx11::string::~string((string *)&dy);
  uVar12 = (ulong)(this->super_TriangleDerivateCase).m_definitions.precision;
  if (uVar12 < 3) {
    fVar1 = *(float *)(&DAT_009b3b58 + uVar12 * 4);
    fVar2 = *(float *)(&DAT_009b3b64 + uVar12 * 4);
    fVar3 = *(float *)(&DAT_009b3b70 + uVar12 * 4);
    fVar4 = *(float *)(&DAT_009b3b7c + uVar12 * 4);
    fVar5 = *(float *)(&DAT_009b3b88 + uVar12 * 4);
    fVar6 = *(float *)(&DAT_009b3b94 + uVar12 * 4);
    fVar7 = *(float *)(&DAT_009b3ba0 + uVar12 * 4);
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[0] =
         *(float *)(&DAT_009b3b4c + uVar12 * 4);
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[1] = fVar1;
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[2] = fVar2;
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[3] = fVar3;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[0] = fVar4;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[1] = fVar5;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[2] = fVar6;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[3] = fVar7;
  }
  if ((this->super_TriangleDerivateCase).m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO) {
    tcu::Vector<float,_4>::Vector(&dx,1.0);
    *(ulong *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data =
         CONCAT44(dx.m_data[1],dx.m_data[0]);
    *(ulong *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) =
         CONCAT44(dx.m_data[3],dx.m_data[2]);
    tcu::Vector<float,_4>::Vector(&dx,0.0);
    goto LAB_005994b2;
  }
  b = &(this->super_TriangleDerivateCase).m_values;
  a = &(this->super_TriangleDerivateCase).m_values.coordMax;
  tcu::operator-((tcu *)&dy,a,&b->coordMin);
  local_e8._M_dataplus._M_p = (pointer)0x42c6000042c60000;
  local_e8._M_string_length = 0xc246000042460000;
  tcu::operator/((tcu *)&dx,&dy,(Vector<float,_4> *)&local_e8);
  tcu::operator-((tcu *)&local_e8,a,&b->coordMin);
  local_88.m_data[0] = 133.0;
  local_88.m_data[1] = 133.0;
  local_88.m_data[2] = 66.5;
  local_88.m_data[3] = -66.5;
  tcu::operator/((tcu *)&dy,(Vector<float,_4> *)&local_e8,&local_88);
  DVar9 = (this->super_TriangleDerivateCase).m_definitions.func;
  if (DVar9 < DERIVATE_DFDY) {
    tcu::operator/((tcu *)&local_e8,0.5,&dx);
LAB_005994a3:
    *(pointer *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data =
         local_e8._M_dataplus._M_p;
    *(size_type *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) =
         local_e8._M_string_length;
  }
  else {
    if (DVar9 - DERIVATE_DFDY < 3) {
      tcu::operator/((tcu *)&local_e8,0.5,&dy);
      goto LAB_005994a3;
    }
    if (DVar9 - DERIVATE_FWIDTH < 3) {
      tcu::abs<float,4>((tcu *)&local_30,&dx);
      tcu::abs<float,4>((tcu *)&local_40,&dy);
      tcu::operator+((tcu *)&local_88,&local_30,&local_40);
      tcu::operator/((tcu *)&local_e8,0.5,&local_88);
      goto LAB_005994a3;
    }
  }
  dx.m_data[0] = 0.0;
  dx.m_data[1] = 0.0;
  dx.m_data[2] = 0.0;
  dx.m_data[3] = 0.0;
LAB_005994b2:
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[0] = dx.m_data[0];
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[1] = dx.m_data[1];
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[2] = dx.m_data[2];
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[3] = dx.m_data[3];
  std::__cxx11::string::~string((string *)&fragmentSrc);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragmentParams._M_t);
  return;
}

Assistant:

void LinearDerivateCase::initPrograms (vk::SourceCollections& programCollection) const
{
	const tcu::UVec2	viewportSize	(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	const float			w				= float(viewportSize.x());
	const float			h				= float(viewportSize.y());
	const bool			packToInt		= m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO;
	map<string, string>	fragmentParams;

	fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
	fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_definitions.precision);
	fragmentParams["PRECISION"]			= glu::getPrecisionName(m_definitions.precision);
	fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_definitions.dataType);
	fragmentParams["FUNC"]				= getDerivateFuncName(m_definitions.func);

	if (packToInt)
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
											  /* TYPE_FLOAT */								   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
	}
	else
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
											  /* TYPE_FLOAT */								   "vec4(res, 0.0, 0.0, 1.0)";
	}

	std::string fragmentSrc = tcu::StringTemplate(m_fragmentTmpl).specialize(fragmentParams);
	programCollection.glslSources.add("vert") << glu::VertexSource(genVertexSource(m_definitions.coordDataType, m_definitions.coordPrecision));
	programCollection.glslSources.add("frag") << glu::FragmentSource(fragmentSrc);

	switch (m_definitions.precision)
	{
		case glu::PRECISION_HIGHP:
			m_values.coordMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_values.coordMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_values.coordMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_values.coordMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_values.coordMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_values.coordMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	if (m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_values.derivScale	= tcu::Vec4(1.0f);
		m_values.derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::Vec4 dx = (m_values.coordMax - m_values.coordMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4 dy = (m_values.coordMax - m_values.coordMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		if (isDfdxFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dx;
		else if (isDfdyFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dy;
		else if (isFwidthFunc(m_definitions.func))
			m_values.derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
		else
			DE_ASSERT(false);

		m_values.derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}